

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

_Bool update_component_monitor_w_array
                (ecs_world_t *world,ecs_component_monitor_t *mon,ecs_entities_t *entities)

{
  ulong component_00;
  ecs_entities_t eVar1;
  undefined1 local_58 [8];
  ecs_entities_t base_entities;
  ecs_type_t type;
  ecs_entity_t base;
  ecs_entity_t component;
  int i;
  _Bool childof_changed;
  ecs_entities_t *entities_local;
  ecs_component_monitor_t *mon_local;
  ecs_world_t *world_local;
  
  world_local._7_1_ = false;
  if (entities == (ecs_entities_t *)0x0) {
    world_local._7_1_ = false;
  }
  else {
    for (component._0_4_ = 0; (int)component < entities->count; component._0_4_ = (int)component + 1
        ) {
      component_00 = entities->array[(int)component];
      if (component_00 < 0x100) {
        ecs_component_monitor_mark(mon,component_00);
      }
      else if ((component_00 & 0xff00000000000000) == 0xfd00000000000000) {
        world_local._7_1_ = true;
      }
      else if ((component_00 & 0xff00000000000000) == 0xfe00000000000000) {
        base_entities._8_8_ = ecs_get_type(world,component_00 & 0xffffffffffffff);
        eVar1 = ecs_type_to_entities((ecs_type_t)base_entities._8_8_);
        local_58 = (undefined1  [8])eVar1.array;
        base_entities.array._0_4_ = eVar1.count;
        update_component_monitor_w_array(world,mon,(ecs_entities_t *)local_58);
      }
    }
  }
  return world_local._7_1_;
}

Assistant:

static
bool update_component_monitor_w_array(
    ecs_world_t *world,
    ecs_component_monitor_t * mon,
    ecs_entities_t * entities)
{
    bool childof_changed = false;

    if (!entities) {
        return false;
    }

    int i;
    for (i = 0; i < entities->count; i ++) {
        ecs_entity_t component = entities->array[i];
        if (component < ECS_HI_COMPONENT_ID) {
            ecs_component_monitor_mark(mon, component);
        } else if (ECS_HAS_ROLE(component, CHILDOF)) {
            childof_changed = true;
        } else if (ECS_HAS_ROLE(component, INSTANCEOF)) {
            /* If an INSTANCEOF relationship is added to a monitored entity (can
             * be either a parent or a base) component monitors need to be
             * evaluated for the components of the prefab. */
            ecs_entity_t base = component & ECS_COMPONENT_MASK;
            ecs_type_t type = ecs_get_type(world, base);
            ecs_entities_t base_entities = ecs_type_to_entities(type);

            /* This evaluates the component monitor for all components of the
             * base entity. If the base entity contains INSTANCEOF relationships
             * these will be evaluated recursively as well. */
            update_component_monitor_w_array(world, mon, &base_entities);               
        }
    }

    return childof_changed;
}